

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void mi_arenas_try_purge(_Bool force,_Bool visit_all)

{
  ulong uVar1;
  mi_arena_t *arena;
  size_t sVar2;
  _Bool _Var3;
  bool bVar4;
  long lVar5;
  long lVar6;
  mi_msecs_t mVar7;
  ulong bitmap_idx;
  mi_msecs_t mVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  size_t count_00;
  ulong uVar13;
  bool bVar14;
  size_t count;
  ulong uVar15;
  bool bVar16;
  ulong local_90;
  
  _Var3 = _mi_preloading();
  if (!_Var3) {
    lVar5 = mi_option_get(mi_option_purge_delay);
    lVar6 = mi_option_get(mi_option_arena_purge_mult);
    if ((0 < lVar6 * lVar5) &&
       (((mVar7 = _mi_clock_now(), sVar2 = mi_arena_count, force ||
         (mVar7 <= mi_arenas_purge_expire && mi_arenas_purge_expire != 0)) && (mi_arena_count != 0))
       )) {
      LOCK();
      bVar16 = mi_arenas_try_purge::purge_guard == 0;
      if (bVar16) {
        mi_arenas_try_purge::purge_guard = 1;
      }
      UNLOCK();
      if (bVar16) {
        local_90 = 2;
        if (visit_all) {
          local_90 = mi_arena_count;
        }
        lVar5 = mi_option_get(mi_option_purge_delay);
        lVar6 = mi_option_get(mi_option_arena_purge_mult);
        mi_arenas_purge_expire = lVar6 * lVar5 + mVar7;
        bVar16 = true;
        uVar13 = 0;
        do {
          arena = mi_arenas[uVar13];
          if (((arena == (mi_arena_t *)0x0) || ((arena->memid).is_pinned != false)) ||
             ((lVar5 = arena->purge_expire, !force && (mVar7 < lVar5 || lVar5 == 0)))) {
            bVar4 = true;
          }
          else {
            bVar14 = false;
            LOCK();
            if (lVar5 == arena->purge_expire) {
              arena->purge_expire = 0;
            }
            UNLOCK();
            _mi_stat_counter_increase(&_mi_stats_main.arena_purges,1);
            if (arena->field_count == 0) {
              bVar4 = true;
            }
            else {
              bVar4 = true;
              bVar14 = false;
              uVar9 = 0;
              do {
                uVar11 = arena->blocks_purge[uVar9];
                if (uVar11 != 0) {
                  uVar10 = 0;
LAB_004fa7b1:
                  sVar12 = 0;
                  do {
                    count_00 = sVar12;
                    if ((uVar11 >> ((ulong)(uint)((int)uVar10 + (int)sVar12) & 0x3f) & 1) == 0)
                    break;
                    lVar5 = uVar10 + sVar12;
                    sVar12 = sVar12 + 1;
                    count_00 = 0x40 - uVar10;
                  } while (lVar5 != 0x3f);
                  if (count_00 != 0) {
                    bitmap_idx = uVar10 | uVar9 * 0x40;
LAB_004fa7f2:
                    _Var3 = _mi_bitmap_try_claim
                                      (arena->blocks_inuse,arena->field_count,count_00,bitmap_idx);
                    if (!_Var3) goto code_r0x004fa80a;
                    uVar11 = arena->blocks_purge[uVar9];
                    uVar1 = uVar10 + count_00;
                    if (uVar10 < uVar1) {
                      bVar14 = false;
                      uVar15 = uVar10;
                      do {
                        sVar12 = 0;
                        do {
                          if ((uVar11 >> ((ulong)(uint)((int)uVar15 + (int)sVar12) & 0x3f) & 1) == 0
                             ) break;
                          lVar5 = uVar15 + sVar12;
                          sVar12 = sVar12 + 1;
                        } while (lVar5 + 1U < uVar1);
                        if ((sVar12 != 0) &&
                           (mi_arena_purge(arena,uVar15 + uVar9 * 0x40,sVar12), sVar12 == count_00))
                        {
                          bVar14 = true;
                        }
                        uVar15 = uVar15 + sVar12 + 1;
                      } while (uVar15 < uVar1);
                      if (!bVar14) {
                        bVar4 = false;
                      }
                    }
                    else {
                      bVar4 = false;
                    }
                    _mi_bitmap_unclaim(arena->blocks_inuse,arena->field_count,count_00,bitmap_idx);
                    bVar14 = true;
                  }
                  goto LAB_004fa8d0;
                }
LAB_004fa8e0:
                uVar9 = uVar9 + 1;
              } while (uVar9 < arena->field_count);
            }
            if (!bVar4) {
              lVar5 = mi_option_get(mi_option_purge_delay);
              lVar6 = mi_option_get(mi_option_arena_purge_mult);
              mVar8 = _mi_clock_now();
              LOCK();
              if (arena->purge_expire == 0) {
                arena->purge_expire = mVar8 + lVar6 * lVar5;
              }
              UNLOCK();
            }
            bVar4 = true;
            if (bVar14) {
              if (local_90 < 2) {
                local_90 = 1;
                bVar16 = false;
                bVar4 = false;
              }
              else {
                local_90 = local_90 - 1;
              }
            }
          }
        } while ((bVar4) && (uVar13 = uVar13 + 1, uVar13 < sVar2));
        if (bVar16) {
          mi_arenas_purge_expire = 0;
        }
        mi_arenas_try_purge::purge_guard = 0;
      }
    }
  }
  return;
code_r0x004fa80a:
  count_00 = count_00 - 1;
  if (count_00 == 0) goto code_r0x004fa80f;
  goto LAB_004fa7f2;
code_r0x004fa80f:
  count_00 = 0;
LAB_004fa8d0:
  uVar10 = uVar10 + count_00 + 1;
  if (0x3f < uVar10) goto LAB_004fa8e0;
  goto LAB_004fa7b1;
}

Assistant:

static void mi_arenas_try_purge( bool force, bool visit_all ) 
{
  if (_mi_preloading() || mi_arena_purge_delay() <= 0) return;  // nothing will be scheduled

  // check if any arena needs purging?
  const mi_msecs_t now = _mi_clock_now();
  mi_msecs_t arenas_expire = mi_atomic_loadi64_acquire(&mi_arenas_purge_expire);
  if (!force && (arenas_expire == 0 || arenas_expire < now)) return;

  const size_t max_arena = mi_atomic_load_acquire(&mi_arena_count);
  if (max_arena == 0) return;

  // allow only one thread to purge at a time
  static mi_atomic_guard_t purge_guard;
  mi_atomic_guard(&purge_guard)
  {
    // increase global expire: at most one purge per delay cycle
    mi_atomic_storei64_release(&mi_arenas_purge_expire, now + mi_arena_purge_delay());  
    size_t max_purge_count = (visit_all ? max_arena : 2);
    bool all_visited = true;
    for (size_t i = 0; i < max_arena; i++) {
      mi_arena_t* arena = mi_atomic_load_ptr_acquire(mi_arena_t, &mi_arenas[i]);
      if (arena != NULL) {
        if (mi_arena_try_purge(arena, now, force)) {
          if (max_purge_count <= 1) {
            all_visited = false;
            break;
          }
          max_purge_count--;
        }
      }
    }
    if (all_visited) {
      // all arena's were visited and purged: reset global expire
      mi_atomic_storei64_release(&mi_arenas_purge_expire, 0);
    }
  }
}